

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTimings(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,TYPE ttype)

{
  Timer *pTVar1;
  undefined4 in_ESI;
  long in_RDI;
  TYPE ttype_00;
  undefined4 in_stack_fffffffffffffff0;
  
  ttype_00 = (TYPE)((ulong)in_RDI >> 0x20);
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeTimer((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  **(undefined8 **)(in_RDI + 0x20) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x18) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x20) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 8) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x10) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x30) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x28) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x48) = pTVar1;
  pTVar1 = TimerFactory::switchTimer((Timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ttype_00);
  *(Timer **)(*(long *)(in_RDI + 0x20) + 0x50) = pTVar1;
  return;
}

Assistant:

void SoPlexBase<R>::setTimings(const Timer::TYPE ttype)
{
   _slufactor.changeTimer(ttype);
   _statistics->readingTime = TimerFactory::switchTimer(_statistics->readingTime, ttype);
   _statistics->simplexTime = TimerFactory::switchTimer(_statistics->simplexTime, ttype);
   _statistics->syncTime = TimerFactory::switchTimer(_statistics->syncTime, ttype);
   _statistics->solvingTime = TimerFactory::switchTimer(_statistics->solvingTime, ttype);
   _statistics->preprocessingTime = TimerFactory::switchTimer(_statistics->preprocessingTime, ttype);
   _statistics->rationalTime = TimerFactory::switchTimer(_statistics->rationalTime, ttype);
   _statistics->transformTime = TimerFactory::switchTimer(_statistics->transformTime, ttype);
   _statistics->reconstructionTime = TimerFactory::switchTimer(_statistics->reconstructionTime, ttype);
   _statistics->boostingStepTime = TimerFactory::switchTimer(_statistics->boostingStepTime, ttype);
}